

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O2

void __thiscall
Centaurus::LookaheadDFA<unsigned_char>::print
          (LookaheadDFA<unsigned_char> *this,wostream *os,wstring *graph_name)

{
  uint uVar1;
  wostream *pwVar2;
  pointer pLVar3;
  pointer pLVar4;
  int iVar5;
  ulong uVar6;
  
  pwVar2 = std::operator<<(os,L"digraph ");
  pwVar2 = std::operator<<(pwVar2,(wstring *)graph_name);
  pwVar2 = std::operator<<(pwVar2,L" {");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"rankdir=\"LR\";");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  uVar1 = get_color_num(this);
  for (iVar5 = 1; iVar5 - (~((int)uVar1 >> 0x1f) & uVar1) != 1; iVar5 = iVar5 + 1) {
    pwVar2 = std::operator<<(os,L"A");
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,iVar5);
    std::operator<<(pwVar2,L" [ label=\"");
    std::wostream::operator<<((wostream *)os,iVar5);
    pwVar2 = std::operator<<(os,L"\", shape=doublecircle ];");
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  }
  uVar1 = 0;
  while( true ) {
    pLVar4 = (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar3 = (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pLVar3 - (long)pLVar4) / 0x50) <= (ulong)uVar1) break;
    pwVar2 = std::operator<<(os,L"S");
    pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
    std::operator<<(pwVar2,L" [ label=\"");
    (*(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>)._vptr_NFABase[2])
              (this,os,(ulong)uVar1);
    pwVar2 = std::operator<<(os,L"\", shape=circle ];");
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    uVar1 = uVar1 + 1;
  }
  uVar1 = 0;
  while( true ) {
    uVar6 = (ulong)uVar1;
    if ((ulong)(((long)pLVar3 - (long)pLVar4) / 0x50) <= uVar6) break;
    (*pLVar4[uVar6].
      super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ._vptr_NFABaseState[2])(pLVar4 + uVar6,os,uVar6);
    pLVar4 = (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar3 = (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar1 = uVar1 + 1;
  }
  pwVar2 = std::operator<<(os,L"}");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  return;
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const override
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

        int num_colors = get_color_num();

        for (int i = 1; i <= num_colors; i++)
        {
            os << L"A" << i << L" [ label=\"";
            os << i;
            os << L"\", shape=doublecircle ];" << std::endl;
        }

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}